

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_zip_read(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  jx9_value *pObj;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) || (lVar1 = ((*apArg)->x).iVal, lVar1 == 0)
      ) || (*(int *)(lVar1 + 0x50) != -0x21529ca6)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"Expecting a ZIP archive");
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
  }
  else {
    lVar2 = *(long *)(lVar1 + 8);
    puVar3 = (undefined8 *)(lVar2 + 0x80);
    if (lVar2 == 0) {
      puVar3 = (undefined8 *)(lVar1 + 0x10);
    }
    *(undefined8 *)(lVar1 + 8) = *puVar3;
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    if (lVar2 != 0) {
      (pObj->x).iVal = lVar2;
      pObj->iFlags = pObj->iFlags & 0xfffffe90U | 0x100;
      *(long *)(lVar2 + 0x98) = lVar1 + 0x58;
      return 0;
    }
  }
  (pObj->x).rVal = 0.0;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_zip_read(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pNext = 0; /* cc warning */
	SyArchive *pArchive;
	sxi32 rc;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the in-memory archive */
	pArchive = (SyArchive *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid ZIP archive */
	if( SXARCH_INVALID(pArchive) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the next entry */
	rc = SyArchiveGetNextEntry(pArchive, &pNext);
	if( rc != SXRET_OK ){
		/* No more entries in the central directory, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return as a resource handle */
		jx9_result_resource(pCtx, pNext);
		/* Point to the ZIP raw data */
		pNext->pUserData = (void *)&pArchive[1];
	}
	return JX9_OK;
}